

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O2

GraphicsPipelineBuilder * __thiscall
vkt::synchronization::GraphicsPipelineBuilder::setShader
          (GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkShaderStageFlagBits stage,ProgramBinary *binary,VkSpecializationInfo *specInfo)

{
  Move<vk::Handle<(vk::HandleType)14>_> *this_00;
  VkPipelineShaderStageCreateInfo pipelineShaderStageInfo;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_78;
  undefined1 local_58 [24];
  VkShaderModule VStack_40;
  char *local_38;
  VkSpecializationInfo *local_30;
  
  switch(stage) {
  case VK_SHADER_STAGE_VERTEX_BIT:
    ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&local_78,vk,device,binary,0);
    local_58._16_8_ = local_78.m_data.deleter.m_device;
    VStack_40.m_internal = (deUint64)local_78.m_data.deleter.m_allocator;
    local_58._0_8_ = local_78.m_data.object.m_internal;
    local_58._8_8_ = local_78.m_data.deleter.m_deviceIface;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    this_00 = &this->m_vertexShaderModule;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
              (&this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    break;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&local_78,vk,device,binary,0);
    local_58._16_8_ = local_78.m_data.deleter.m_device;
    VStack_40.m_internal = (deUint64)local_78.m_data.deleter.m_allocator;
    local_58._0_8_ = local_78.m_data.object.m_internal;
    local_58._8_8_ = local_78.m_data.deleter.m_deviceIface;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    this_00 = &this->m_tessControlShaderModule;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
              (&this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    break;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
       VK_SHADER_STAGE_VERTEX_BIT:
    goto switchD_0072d099_caseD_3;
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
    ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&local_78,vk,device,binary,0);
    local_58._16_8_ = local_78.m_data.deleter.m_device;
    VStack_40.m_internal = (deUint64)local_78.m_data.deleter.m_allocator;
    local_58._0_8_ = local_78.m_data.object.m_internal;
    local_58._8_8_ = local_78.m_data.deleter.m_deviceIface;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    this_00 = &this->m_tessEvaluationShaderModule;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
              (&this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    break;
  case VK_SHADER_STAGE_GEOMETRY_BIT:
    ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&local_78,vk,device,binary,0);
    local_58._16_8_ = local_78.m_data.deleter.m_device;
    VStack_40.m_internal = (deUint64)local_78.m_data.deleter.m_allocator;
    local_58._0_8_ = local_78.m_data.object.m_internal;
    local_58._8_8_ = local_78.m_data.deleter.m_deviceIface;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    this_00 = &this->m_geometryShaderModule;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
              (&this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    break;
  default:
    if (stage != VK_SHADER_STAGE_FRAGMENT_BIT) {
      return this;
    }
    ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&local_78,vk,device,binary,0);
    local_58._16_8_ = local_78.m_data.deleter.m_device;
    VStack_40.m_internal = (deUint64)local_78.m_data.deleter.m_allocator;
    local_58._0_8_ = local_78.m_data.object.m_internal;
    local_58._8_8_ = local_78.m_data.deleter.m_deviceIface;
    local_78.m_data.object.m_internal = 0;
    local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_78.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    this_00 = &this->m_fragmentShaderModule;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
              (&this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  }
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
       (VkDevice)local_58._16_8_;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_40.m_internal;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
       local_58._0_8_;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_58._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_78);
  VStack_40.m_internal =
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  local_58._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_58._8_8_ = (void *)0x0;
  local_58._16_8_ = (ulong)stage << 0x20;
  local_38 = "main";
  this->m_shaderStageFlags = this->m_shaderStageFlags | stage;
  local_30 = specInfo;
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::push_back(&this->m_shaderStages,(value_type *)local_58);
switchD_0072d099_caseD_3:
  return this;
}

Assistant:

GraphicsPipelineBuilder& GraphicsPipelineBuilder::setShader (const DeviceInterface&			vk,
															 const VkDevice					device,
															 const VkShaderStageFlagBits	stage,
															 const ProgramBinary&			binary,
															 const VkSpecializationInfo*	specInfo)
{
	VkShaderModule module;
	switch (stage)
	{
		case (VK_SHADER_STAGE_VERTEX_BIT):
			DE_ASSERT(m_vertexShaderModule.get() == DE_NULL);
			m_vertexShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_vertexShaderModule;
			break;

		case (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT):
			DE_ASSERT(m_tessControlShaderModule.get() == DE_NULL);
			m_tessControlShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_tessControlShaderModule;
			break;

		case (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT):
			DE_ASSERT(m_tessEvaluationShaderModule.get() == DE_NULL);
			m_tessEvaluationShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_tessEvaluationShaderModule;
			break;

		case (VK_SHADER_STAGE_GEOMETRY_BIT):
			DE_ASSERT(m_geometryShaderModule.get() == DE_NULL);
			m_geometryShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_geometryShaderModule;
			break;

		case (VK_SHADER_STAGE_FRAGMENT_BIT):
			DE_ASSERT(m_fragmentShaderModule.get() == DE_NULL);
			m_fragmentShaderModule = createShaderModule(vk, device, binary, (VkShaderModuleCreateFlags)0);
			module = *m_fragmentShaderModule;
			break;

		default:
			DE_FATAL("Invalid shader stage");
			return *this;
	}

	const VkPipelineShaderStageCreateInfo pipelineShaderStageInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
		stage,													// VkShaderStageFlagBits				stage;
		module,													// VkShaderModule						module;
		"main",													// const char*							pName;
		specInfo,												// const VkSpecializationInfo*			pSpecializationInfo;
	};

	m_shaderStageFlags |= stage;
	m_shaderStages.push_back(pipelineShaderStageInfo);

	return *this;
}